

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

LogicalExpr __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter>::ReadLogicalExpr
          (NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter> *this)

{
  TextReader<fmt::Locale> *this_00;
  char *loc;
  int opcode;
  LogicalExpr LVar1;
  undefined8 local_28;
  undefined8 uStack_20;
  ArgList local_18;
  
  local_18.field_1.values_ = (Value *)&local_28;
  this_00 = this->reader_;
  loc = (this_00->super_ReaderBase).ptr_;
  (this_00->super_ReaderBase).token_ = loc;
  (this_00->super_ReaderBase).ptr_ = loc + 1;
  switch(*loc) {
  case 'l':
  case 'n':
  case 's':
    ReadConstant(this,*loc);
    break;
  default:
    local_28 = 0;
    uStack_20 = 0;
    local_18.types_ = 0;
    TextReader<fmt::Locale>::DoReportError(this_00,loc,(CStringRef)0x139fc1,&local_18);
    break;
  case 'o':
    opcode = ReadOpCode(this);
    LVar1 = ReadLogicalExpr(this,opcode);
    return LVar1;
  }
  return OTHER;
}

Assistant:

typename Handler::LogicalExpr NLReader<Reader, Handler>::ReadLogicalExpr() {
  switch (char c = reader_.ReadChar()) {
  case 'n': case 'l': case 's':
    return handler_.OnBool(ReadConstant(c) != 0);
  case 'o':
    return ReadLogicalExpr(ReadOpCode());
  }
  reader_.ReportError("expected logical expression");
  return LogicalExpr();
}